

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::ShapeHandle::Create
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,string *name,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  span<const_pbrt::Point3<float>_> p;
  Transform *args;
  bool bVar1;
  int nLevels;
  Sphere *pSVar2;
  Cylinder *pCVar3;
  Disk *pDVar4;
  BilinearPatchMesh *pBVar5;
  TriangleMesh *pTVar6;
  char *fmt;
  undefined7 in_register_00000081;
  FileLoc *loc_00;
  long in_FS_OFFSET;
  span<const_int> vertexIndices_00;
  bool reverseOrientation_local;
  allocator<char> local_171;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_170;
  Transform *local_168;
  allocator<char> local_159;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> quadMesh;
  string filename;
  Allocator alloc_local;
  TriQuadMesh plyMesh;
  vector<int,_std::allocator<int>_> vertexIndices;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  
  loc_00 = (FileLoc *)CONCAT71(in_register_00000081,reverseOrientation);
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  alloc_local = alloc;
  reverseOrientation_local = reverseOrientation;
  local_170 = __return_storage_ptr__;
  bVar1 = std::operator==(name,"sphere");
  if (bVar1) {
    pSVar2 = Sphere::Create(renderFromObject,objectFromRender,reverseOrientation,parameters,loc_00,
                            alloc);
    filename._M_dataplus._M_p = (pointer)((ulong)pSVar2 | 0x1000000000000);
    quadMesh.alloc.memoryResource = pstd::pmr::new_delete_resource();
    pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
    vector<pbrt::ShapeHandle_const*>
              ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *)
               &plyMesh,(ShapeHandle *)&filename,(ShapeHandle *)&filename._M_string_length,
               &quadMesh.alloc);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::operator=
              (local_170,
               (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               &plyMesh);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
              ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               &plyMesh);
    *(long *)(in_FS_OFFSET + -0x460) = *(long *)(in_FS_OFFSET + -0x460) + 1;
  }
  else {
    local_168 = renderFromObject;
    bVar1 = std::operator==(name,"cylinder");
    if (bVar1) {
      pCVar3 = Cylinder::Create(local_168,objectFromRender,reverseOrientation,parameters,loc_00,
                                alloc);
      filename._M_dataplus._M_p = (pointer)((ulong)pCVar3 | 0x2000000000000);
      quadMesh.alloc.memoryResource = pstd::pmr::new_delete_resource();
      pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
      vector<pbrt::ShapeHandle_const*>
                ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *)
                 &plyMesh,(ShapeHandle *)&filename,(ShapeHandle *)&filename._M_string_length,
                 &quadMesh.alloc);
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
      operator=(local_170,
                (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                &plyMesh);
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
                ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                 &plyMesh);
      *(long *)(in_FS_OFFSET + -0x458) = *(long *)(in_FS_OFFSET + -0x458) + 1;
    }
    else {
      bVar1 = std::operator==(name,"disk");
      if (bVar1) {
        pDVar4 = Disk::Create(local_168,objectFromRender,reverseOrientation,parameters,loc_00,alloc)
        ;
        filename._M_dataplus._M_p = (pointer)((ulong)pDVar4 | 0x3000000000000);
        quadMesh.alloc.memoryResource = pstd::pmr::new_delete_resource();
        pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
        vector<pbrt::ShapeHandle_const*>
                  ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *)
                   &plyMesh,(ShapeHandle *)&filename,(ShapeHandle *)&filename._M_string_length,
                   &quadMesh.alloc);
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        operator=(local_170,
                  (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )&plyMesh);
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                &plyMesh);
        *(long *)(in_FS_OFFSET + -0x450) = *(long *)(in_FS_OFFSET + -0x450) + 1;
      }
      else {
        bVar1 = std::operator==(name,"bilinearmesh");
        if (bVar1) {
          pBVar5 = BilinearPatch::CreateMesh(local_168,reverseOrientation,parameters,loc,alloc);
          BilinearPatch::CreatePatches
                    ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                      *)&plyMesh,pBVar5,alloc);
          pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          operator=(local_170,
                    (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                     *)&plyMesh);
        }
        else {
          bVar1 = std::operator==(name,"curve");
          if (bVar1) {
            Curve::Create((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)&plyMesh,local_168,objectFromRender,reverseOrientation,parameters,loc,
                          alloc);
            pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
            operator=(local_170,
                      (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)&plyMesh);
          }
          else {
            bVar1 = std::operator==(name,"trianglemesh");
            if (!bVar1) {
              bVar1 = std::operator==(name,"plymesh");
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&quadMesh,"filename",(allocator<char> *)&P);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&vertexIndices,"",&local_171);
                args = local_168;
                ParameterDictionary::GetOneString
                          ((string *)&plyMesh,parameters,(string *)&quadMesh,
                           (string *)&vertexIndices);
                ResolveFilename(&filename,(string *)&plyMesh);
                std::__cxx11::string::~string((string *)&plyMesh);
                std::__cxx11::string::~string((string *)&vertexIndices);
                std::__cxx11::string::~string((string *)&quadMesh);
                TriQuadMesh::ReadPLY(&plyMesh,&filename);
                if (plyMesh.triIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    plyMesh.triIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  quadMesh.nAlloc = 0;
                  quadMesh.alloc.memoryResource = (memory_resource *)0x0;
                  quadMesh.ptr = (ShapeHandle *)0x0;
                  pTVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
                           new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&>
                                     (&alloc_local,args,&reverseOrientation_local,
                                      &plyMesh.triIndices,&plyMesh.p,
                                      (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                       *)&quadMesh,&plyMesh.n,&plyMesh.uv,&plyMesh.faceIndices);
                  std::_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::
                  ~_Vector_base((_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                 *)&quadMesh);
                  Triangle::CreateTriangles(&quadMesh,pTVar6,alloc_local);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  operator=(local_170,&quadMesh);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector(&quadMesh);
                }
                if (plyMesh.quadIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    plyMesh.quadIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  quadMesh.alloc.memoryResource = (memory_resource *)0x0;
                  pBVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
                           new_object<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&,decltype(nullptr)>
                                     (&alloc_local,args,&reverseOrientation_local,
                                      &plyMesh.quadIndices,&plyMesh.p,&plyMesh.n,&plyMesh.uv,
                                      &plyMesh.faceIndices,(void **)&quadMesh);
                  BilinearPatch::CreatePatches(&quadMesh,pBVar5,alloc_local);
                  pstd::
                  vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
                  insert<pbrt::ShapeHandle*>
                            ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>
                              *)local_170,local_170->ptr + local_170->nStored,quadMesh.ptr,
                             quadMesh.ptr + quadMesh.nStored);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector(&quadMesh);
                }
                TriQuadMesh::~TriQuadMesh(&plyMesh);
                std::__cxx11::string::~string((string *)&filename);
              }
              else {
                bVar1 = std::operator==(name,"loopsubdiv");
                if (!bVar1) {
                  fmt = "%s: shape type unknown.";
                  goto LAB_0040b96a;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&plyMesh,"levels",(allocator<char> *)&filename);
                nLevels = ParameterDictionary::GetOneInt(parameters,(string *)&plyMesh,3);
                std::__cxx11::string::~string((string *)&plyMesh);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&plyMesh,"indices",(allocator<char> *)&filename);
                ParameterDictionary::GetIntArray(&vertexIndices,parameters,(string *)&plyMesh);
                std::__cxx11::string::~string((string *)&plyMesh);
                if (vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  ErrorExit(loc,"Vertex indices \"indices\" not provided for LoopSubdiv shape.");
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&plyMesh,"P",(allocator<char> *)&filename);
                ParameterDictionary::GetPoint3fArray(&P,parameters,(string *)&plyMesh);
                std::__cxx11::string::~string((string *)&plyMesh);
                if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ErrorExit(loc,"Vertex positions \"P\" not provided for LoopSubdiv shape.");
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename,"scheme",&local_171);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&quadMesh,"loop",&local_159);
                ParameterDictionary::GetOneString
                          ((string *)&plyMesh,parameters,&filename,(string *)&quadMesh);
                std::__cxx11::string::~string((string *)&quadMesh);
                std::__cxx11::string::~string((string *)&filename);
                vertexIndices_00.n =
                     (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
                p.n = ((long)P.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)P.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                p.ptr = P.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                vertexIndices_00.ptr =
                     vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pTVar6 = LoopSubdivide(local_168,reverseOrientation,nLevels,vertexIndices_00,p,alloc
                                      );
                Triangle::CreateTriangles
                          ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                            *)&filename,pTVar6,alloc);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                operator=(local_170,
                          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)&filename);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                         *)&filename);
                std::__cxx11::string::~string((string *)&plyMesh);
                std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                ~_Vector_base(&P.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             );
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&vertexIndices.super__Vector_base<int,_std::allocator<int>_>);
              }
              goto LAB_0040b502;
            }
            pTVar6 = Triangle::CreateMesh(local_168,reverseOrientation,parameters,loc,alloc);
            Triangle::CreateTriangles
                      ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                        *)&plyMesh,pTVar6,alloc);
            pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
            operator=(local_170,
                      (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)&plyMesh);
          }
        }
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                &plyMesh);
      }
    }
  }
LAB_0040b502:
  if (local_170->nStored != 0) {
    return local_170;
  }
  fmt = "%s: unable to create shape.";
LAB_0040b96a:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

pstd::vector<ShapeHandle> ShapeHandle::Create(const std::string &name,
                                              const Transform *renderFromObject,
                                              const Transform *objectFromRender,
                                              bool reverseOrientation,
                                              const ParameterDictionary &parameters,
                                              const FileLoc *loc, Allocator alloc) {
    pstd::vector<ShapeHandle> shapes(alloc);
    if (name == "sphere") {
        shapes = {Sphere::Create(renderFromObject, objectFromRender, reverseOrientation,
                                 parameters, loc, alloc)};
        ++nSpheres;
    }
    // Create remaining single _Shape_ types
    else if (name == "cylinder") {
        shapes = {Cylinder::Create(renderFromObject, objectFromRender, reverseOrientation,
                                   parameters, loc, alloc)};
        ++nCylinders;
    } else if (name == "disk") {
        shapes = {Disk::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc)};
        ++nDisks;
    } else if (name == "bilinearmesh") {
        BilinearPatchMesh *mesh = BilinearPatch::CreateMesh(
            renderFromObject, reverseOrientation, parameters, loc, alloc);
        shapes = BilinearPatch::CreatePatches(mesh, alloc);
    }
    // Create multiple-_Shape_ types
    else if (name == "curve")
        shapes = Curve::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc);
    else if (name == "trianglemesh") {
        TriangleMesh *mesh = Triangle::CreateMesh(renderFromObject, reverseOrientation,
                                                  parameters, loc, alloc);
        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else if (name == "plymesh") {
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        TriQuadMesh plyMesh = TriQuadMesh::ReadPLY(filename);

        if (!plyMesh.triIndices.empty()) {
            TriangleMesh *mesh = alloc.new_object<TriangleMesh>(
                *renderFromObject, reverseOrientation, plyMesh.triIndices, plyMesh.p,
                std::vector<Vector3f>(), plyMesh.n, plyMesh.uv, plyMesh.faceIndices);
            shapes = Triangle::CreateTriangles(mesh, alloc);
        }

        if (!plyMesh.quadIndices.empty()) {
            BilinearPatchMesh *mesh = alloc.new_object<BilinearPatchMesh>(
                *renderFromObject, reverseOrientation, plyMesh.quadIndices, plyMesh.p,
                plyMesh.n, plyMesh.uv, plyMesh.faceIndices, nullptr /* image dist */);
            pstd::vector<ShapeHandle> quadMesh =
                BilinearPatch::CreatePatches(mesh, alloc);
            shapes.insert(shapes.end(), quadMesh.begin(), quadMesh.end());
        }
    } else if (name == "loopsubdiv") {
        int nLevels = parameters.GetOneInt("levels", 3);
        std::vector<int> vertexIndices = parameters.GetIntArray("indices");
        if (vertexIndices.empty())
            ErrorExit(loc, "Vertex indices \"indices\" not provided for "
                           "LoopSubdiv shape.");

        std::vector<Point3f> P = parameters.GetPoint3fArray("P");
        if (P.empty())
            ErrorExit(loc, "Vertex positions \"P\" not provided for LoopSubdiv shape.");

        // don't actually use this for now...
        std::string scheme = parameters.GetOneString("scheme", "loop");

        TriangleMesh *mesh = LoopSubdivide(renderFromObject, reverseOrientation, nLevels,
                                           vertexIndices, P, alloc);

        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else
        ErrorExit(loc, "%s: shape type unknown.", name);

    if (shapes.empty())
        ErrorExit(loc, "%s: unable to create shape.", name);

    return shapes;
}